

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_delegate.cc
# Opt level: O2

void absl::base_internal::anon_unknown_2::Throw<std::range_error>(range_error *error)

{
  range_error *this;
  
  this = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(this,error);
  __cxa_throw(this,&std::range_error::typeinfo,std::range_error::~range_error);
}

Assistant:

[[noreturn]] void Throw(const T& error) {
#ifdef ABSL_HAVE_EXCEPTIONS
  throw error;
#else
  ABSL_RAW_LOG(FATAL, "%s", error.what());
  std::abort();
#endif
}